

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O2

int mbedtls_ecdsa_sign(mbedtls_ecp_group *grp,mbedtls_mpi *r,mbedtls_mpi *s,mbedtls_mpi *d,
                      uchar *buf,size_t blen,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *B;
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  mbedtls_mpi e;
  mbedtls_mpi t;
  mbedtls_mpi k;
  mbedtls_ecp_point R;
  
  if ((grp->N).p == (mbedtls_mpi_uint *)0x0) {
    iVar1 = -0x4f80;
  }
  else {
    B = &grp->N;
    mbedtls_ecp_point_init(&R);
    mbedtls_mpi_init(&k);
    mbedtls_mpi_init(&e);
    mbedtls_mpi_init(&t);
    iVar2 = 0;
    do {
      iVar3 = 0xc;
      do {
        iVar1 = mbedtls_ecp_gen_keypair(grp,&k,&R,f_rng,p_rng);
        if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_mod_mpi(r,&R.X,B), iVar1 != 0)) goto LAB_0016b638;
        iVar3 = iVar3 + -1;
        if (iVar3 == 0) goto LAB_0016b632;
        iVar1 = mbedtls_mpi_cmp_int(r,0);
      } while (iVar1 == 0);
      iVar1 = derive_mpi(grp,&e,buf,blen);
      if (iVar1 != 0) break;
      iVar3 = 0x1e;
      do {
        uVar4 = grp->nbits + 7;
        iVar1 = mbedtls_mpi_fill_random(&t,uVar4 >> 3,f_rng,p_rng);
        if ((iVar1 != 0) ||
           (iVar1 = mbedtls_mpi_shift_r(&t,(uVar4 & 0xfffffffffffffff8) - grp->nbits), iVar1 != 0))
        goto LAB_0016b638;
        bVar5 = iVar3 == 0;
        iVar3 = iVar3 + -1;
        if (bVar5) {
          return -0x4d00;
        }
        iVar1 = mbedtls_mpi_cmp_int(&t,1);
      } while ((iVar1 < 0) || (iVar1 = mbedtls_mpi_cmp_mpi(&t,B), -1 < iVar1));
      iVar1 = mbedtls_mpi_mul_mpi(s,r,d);
      if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_add_mpi(&e,&e,s), iVar1 != 0)) break;
      iVar1 = mbedtls_mpi_mul_mpi(&e,&e,&t);
      if ((((iVar1 != 0) || (iVar1 = mbedtls_mpi_mul_mpi(&k,&k,&t), iVar1 != 0)) ||
          (iVar1 = mbedtls_mpi_inv_mod(s,&k,B), iVar1 != 0)) ||
         ((iVar1 = mbedtls_mpi_mul_mpi(s,s,&e), iVar1 != 0 ||
          (iVar1 = mbedtls_mpi_mod_mpi(s,s,B), iVar1 != 0)))) break;
      if (iVar2 == 0xb) {
LAB_0016b632:
        iVar1 = -0x4d00;
        break;
      }
      iVar2 = iVar2 + 1;
      iVar1 = 0;
      iVar3 = mbedtls_mpi_cmp_int(s,0);
    } while (iVar3 == 0);
LAB_0016b638:
    mbedtls_ecp_point_free(&R);
    mbedtls_mpi_free(&k);
    mbedtls_mpi_free(&e);
    mbedtls_mpi_free(&t);
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_sign( mbedtls_ecp_group *grp, mbedtls_mpi *r, mbedtls_mpi *s,
                const mbedtls_mpi *d, const unsigned char *buf, size_t blen,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret, key_tries, sign_tries, blind_tries;
    mbedtls_ecp_point R;
    mbedtls_mpi k, e, t;

    /* Fail cleanly on curves such as Curve25519 that can't be used for ECDSA */
    if( grp->N.p == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    mbedtls_ecp_point_init( &R );
    mbedtls_mpi_init( &k ); mbedtls_mpi_init( &e ); mbedtls_mpi_init( &t );

    sign_tries = 0;
    do
    {
        /*
         * Steps 1-3: generate a suitable ephemeral keypair
         * and set r = xR mod n
         */
        key_tries = 0;
        do
        {
            MBEDTLS_MPI_CHK( mbedtls_ecp_gen_keypair( grp, &k, &R, f_rng, p_rng ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( r, &R.X, &grp->N ) );

            if( key_tries++ > 10 )
            {
                ret = MBEDTLS_ERR_ECP_RANDOM_FAILED;
                goto cleanup;
            }
        }
        while( mbedtls_mpi_cmp_int( r, 0 ) == 0 );

        /*
         * Step 5: derive MPI from hashed message
         */
        MBEDTLS_MPI_CHK( derive_mpi( grp, &e, buf, blen ) );

        /*
         * Generate a random value to blind inv_mod in next step,
         * avoiding a potential timing leak.
         */
        blind_tries = 0;
        do
        {
            size_t n_size = ( grp->nbits + 7 ) / 8;
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &t, n_size, f_rng, p_rng ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &t, 8 * n_size - grp->nbits ) );

            /* See mbedtls_ecp_gen_keypair() */
            if( ++blind_tries > 30 )
                return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
        }
        while( mbedtls_mpi_cmp_int( &t, 1 ) < 0 ||
               mbedtls_mpi_cmp_mpi( &t, &grp->N ) >= 0 );

        /*
         * Step 6: compute s = (e + r * d) / k = t (e + rd) / (kt) mod n
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( s, r, d ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &e, &e, s ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &e, &e, &t ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &k, &k, &t ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( s, &k, &grp->N ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( s, s, &e ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( s, s, &grp->N ) );

        if( sign_tries++ > 10 )
        {
            ret = MBEDTLS_ERR_ECP_RANDOM_FAILED;
            goto cleanup;
        }
    }
    while( mbedtls_mpi_cmp_int( s, 0 ) == 0 );

cleanup:
    mbedtls_ecp_point_free( &R );
    mbedtls_mpi_free( &k ); mbedtls_mpi_free( &e ); mbedtls_mpi_free( &t );

    return( ret );
}